

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int str_char(lua_State *L)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  luaL_Buffer b;
  
  b.lvl = 0;
  iVar3 = (int)((ulong)((long)L->top - (long)L->base) >> 4);
  iVar2 = 0;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  iVar3 = 1;
  b.p = b.buffer;
  b.L = L;
  while( true ) {
    if (iVar3 - iVar2 == 1) {
      luaL_pushresult(&b);
      return 1;
    }
    uVar1 = luaL_checkinteger(L,iVar3);
    if ((uVar1 & 0xffffff00) != 0) break;
    if (&stack0xffffffffffffffd0 <= b.p) {
      luaL_prepbuffer(&b);
    }
    *b.p = (char)uVar1;
    iVar3 = iVar3 + 1;
    b.p = b.p + 1;
  }
  luaL_argerror(L,iVar3,"invalid value");
}

Assistant:

static int str_char(lua_State*L){
int n=lua_gettop(L);
int i;
luaL_Buffer b;
luaL_buffinit(L,&b);
for(i=1;i<=n;i++){
int c=luaL_checkint(L,i);
luaL_argcheck(L,uchar(c)==c,i,"invalid value");
luaL_addchar(&b,uchar(c));
}
luaL_pushresult(&b);
return 1;
}